

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

void __thiscall
Js::FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  ProfileId PVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  FunctionBody **ppFVar7;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> **ppWVar8;
  Recycler *pRVar9;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *ptr;
  TrackAllocData local_50;
  FunctionBody *local_28;
  FunctionBody *inlinee_local;
  Recycler *pRStack_18;
  ProfileId profiledCallSiteId_local;
  Recycler *recycler_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_28 = inlinee;
  inlinee_local._6_2_ = profiledCallSiteId;
  pRStack_18 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x46,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._6_2_;
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
  PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x47,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar6 = local_28;
  ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__((WriteBarrierPtr *)this);
  if (pFVar6 != *ppFVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x48,"(inlinee == functionBody)","inlinee == functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  pRVar9 = pRStack_18;
  if (*ppWVar8 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo,0,
               (ulong)PVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
               ,0x4b);
    pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_50);
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                    ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)PVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::operator=
              (&this->inlinees,ptr);
  }
  ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator=
            (*ppWVar8 + inlinee_local._6_2_,this);
  return;
}

Assistant:

void FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee == functionBody);
        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData*), functionBody->GetProfiledCallSiteCount());
        }
        inlinees[profiledCallSiteId] = this;
    }